

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int __thiscall
CVmObjList::set_index_val_q
          (CVmObjList *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val,vm_val_t *new_val)

{
  vm_val_t *this_00;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  char *in_RDI;
  vm_val_t *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00 = CVmStack::push();
  vm_val_t::set_obj(this_00,in_EDX);
  set_index_list(unaff_retaddr,in_RDI,in_RSI,(vm_val_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8))
  ;
  CVmStack::discard();
  return 1;
}

Assistant:

int CVmObjList::set_index_val_q(VMG_ vm_val_t *result, vm_obj_id_t self,
                                const vm_val_t *index_val,
                                const vm_val_t *new_val)
{
    /* put the list on the stack to avoid garbage collection */
    G_stk->push()->set_obj(self);
    
    /* 
     *   use the constant list set-index routine, using our extension data
     *   as the list data 
     */
    set_index_list(vmg_ result, ext_, index_val, new_val);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}